

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama.cpp
# Opt level: O0

int llama_split_prefix(char *split_prefix,size_t maxlen,char *split_path,int split_no,
                      int split_count)

{
  int iVar1;
  int iVar2;
  long lVar3;
  unsigned_long *puVar4;
  int in_ECX;
  undefined8 in_RDX;
  char *in_RDI;
  uint in_R8D;
  int size_prefix;
  string str_postfix;
  char postfix [32];
  string str_split_path;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  string local_a8 [32];
  char local_88 [63];
  allocator<char> local_49;
  string local_48 [32];
  uint local_28;
  int local_24;
  undefined8 local_20;
  unsigned_long local_18;
  char *local_10;
  int local_4;
  
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
             ,(allocator<char> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  std::allocator<char>::~allocator(&local_49);
  snprintf(local_88,0x20,"-%05d-of-%05d.gguf",(ulong)(local_24 + 1),(ulong)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
             ,(allocator<char> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  iVar1 = std::__cxx11::string::size();
  iVar2 = std::__cxx11::string::size();
  iVar1 = iVar1 - iVar2;
  if (0 < iVar1) {
    lVar3 = std::__cxx11::string::find(local_48,(ulong)local_a8);
    if (lVar3 != -1) {
      puVar4 = std::min<unsigned_long>((unsigned_long *)&stack0xffffffffffffff48,&local_18);
      snprintf(local_10,*puVar4,"%s",local_20);
      local_4 = iVar1;
      goto LAB_003aa4f9;
    }
  }
  local_4 = 0;
LAB_003aa4f9:
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_48);
  return local_4;
}

Assistant:

int llama_split_prefix(char * split_prefix, size_t maxlen, const char * split_path, int split_no, int split_count) {
    std::string str_split_path(split_path);
    char postfix[32];
    snprintf(postfix, 32, "-%05d-of-%05d.gguf", split_no + 1, split_count);
    std::string str_postfix(postfix);

    // check if split_prefix ends with postfix
    int size_prefix = str_split_path.size() - str_postfix.size();
    if (size_prefix > 0 && str_split_path.find(str_postfix, size_prefix) != std::string::npos) {
        snprintf(split_prefix, std::min((size_t) size_prefix + 1, maxlen), "%s", split_path);
        return size_prefix;
    }

    return 0;
}